

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructGet
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,StructGet *curr,
          optional<wasm::HeapType> ht)

{
  uintptr_t in_RAX;
  _Storage<wasm::HeapType,_true> heapType;
  Type local_28;
  
  heapType = ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  local_28.id = in_RAX;
  if (((undefined1  [16])
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    heapType._M_value = wasm::Type::getHeapType(&curr->ref->type);
  }
  wasm::Type::Type(&local_28,heapType._M_value,Nullable,Inexact);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->ref,local_28);
  return;
}

Assistant:

void visitStructGet(StructGet* curr,
                      std::optional<HeapType> ht = std::nullopt) {
    if (!ht) {
      ht = curr->ref->type.getHeapType();
    }
    note(&curr->ref, Type(*ht, Nullable));
  }